

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<2,_151>::ResonanceRange::ResonanceRange
          (ResonanceRange *this,double el,double eh,int naps,ResonanceParameters *parameters,
          optional<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius> *scatteringRadius)

{
  ResonanceParameters *this_00;
  bool NRO;
  int NAPS;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_ResonanceRange_hpp:74:40),_const_std::variant<njoy::ENDFtk::section::Type<2,_151>::SpecialCase,_njoy::ENDFtk::section::Type<2,_151>::SingleLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::MultiLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::ReichMoore,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyIndependent,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependent>_&>
  LRU;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_ResonanceRange_hpp:86:40),_const_std::variant<njoy::ENDFtk::section::Type<2,_151>::SpecialCase,_njoy::ENDFtk::section::Type<2,_151>::SingleLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::MultiLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::ReichMoore,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyIndependent,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependent>_&>
  LRF;
  anon_class_1_0_00000001 local_32;
  anon_class_1_0_00000001 local_31;
  
  this->el_ = el;
  this->eh_ = eh;
  this->naps_ = naps;
  this_00 = &this->parameters_;
  std::__detail::__variant::
  _Move_ctor_base<false,_njoy::ENDFtk::section::Type<2,_151>::SpecialCase,_njoy::ENDFtk::section::Type<2,_151>::SingleLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::MultiLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::ReichMoore,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyIndependent,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependent>
  ::_Move_ctor_base((_Move_ctor_base<false,_njoy::ENDFtk::section::Type<2,_151>::SpecialCase,_njoy::ENDFtk::section::Type<2,_151>::SingleLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::MultiLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::ReichMoore,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyIndependent,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependent>
                     *)this_00,
                    (_Move_ctor_base<false,_njoy::ENDFtk::section::Type<2,_151>::SpecialCase,_njoy::ENDFtk::section::Type<2,_151>::SingleLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::MultiLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::ReichMoore,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyIndependent,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependent>
                     *)parameters);
  (this->scattering_radius_).
  super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>.
  _M_payload.
  super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
  .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>._M_engaged =
       false;
  if ((scatteringRadius->
      super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>).
      _M_payload.
      super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
      .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>.
      _M_engaged == true) {
    std::_Optional_payload_base<njoy::ENDFtk::section::Type<2,151>::ScatteringRadius>::
    _M_construct<njoy::ENDFtk::section::Type<2,151>::ScatteringRadius>
              ((_Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius> *)
               &this->scattering_radius_,(ScatteringRadius *)scatteringRadius);
  }
  NRO = (this->scattering_radius_).
        super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>.
        _M_payload.
        super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
        .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>.
        _M_engaged;
  NAPS = this->naps_;
  LRU = std::
        visit<njoy::ENDFtk::section::Type<2,151>::ResonanceRange::LRU()const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<2,151>::SpecialCase,njoy::ENDFtk::section::Type<2,151>::SingleLevelBreitWigner,njoy::ENDFtk::section::Type<2,151>::MultiLevelBreitWigner,njoy::ENDFtk::section::Type<2,151>::ReichMoore,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyIndependent,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependentFissionWidths,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependent>const&>
                  (&local_32,this_00);
  LRF = std::
        visit<njoy::ENDFtk::section::Type<2,151>::ResonanceRange::LRF()const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<2,151>::SpecialCase,njoy::ENDFtk::section::Type<2,151>::SingleLevelBreitWigner,njoy::ENDFtk::section::Type<2,151>::MultiLevelBreitWigner,njoy::ENDFtk::section::Type<2,151>::ReichMoore,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyIndependent,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependentFissionWidths,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependent>const&>
                  (&local_31,this_00);
  verifyOptions(NRO,NAPS,LRU,LRF);
  return;
}

Assistant:

ResonanceRange( double el, double eh, int naps,
                ResonanceParameters&& parameters,
                std::optional< ScatteringRadius >&& scatteringRadius = std::nullopt )
  try : el_( el ), eh_( eh ), naps_( naps ),
        parameters_( std::move( parameters ) ),
        scattering_radius_( std::move( scatteringRadius ) ) {

    verifyOptions( this->NRO(), this->NAPS(), this->LRU(), this->LRF() );
  }
  catch ( std::exception& e ) {

    Log::info( "Encountered error while constructing a resonance range" );
    throw;
  }